

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O3

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  int iVar1;
  ParameterError PVar2;
  CURLcode CVar3;
  char *__s1;
  CURLSH *share;
  CURLcode CVar4;
  size_t i;
  OperationConfig *config;
  
  if (argc < 2) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = strdup(argv[1]);
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (argc == 1) {
    parseconfig((char *)0x0,global);
LAB_00114498:
    if (global->first->url_list == (getout *)0x0) {
      helpf(tool_stderr,(char *)0x0);
      CVar3 = CURLE_FAILED_INIT;
      if (__s1 != (char *)0x0) {
        free(__s1);
      }
      goto switchD_00114511_caseD_9;
    }
    if (__s1 != (char *)0x0) goto LAB_001144e5;
  }
  else if (__s1 != (char *)0x0) {
    if ((((*__s1 != '-') || (__s1[1] != 'q')) && (iVar1 = strcmp(__s1,"--disable"), iVar1 != 0)) &&
       (parseconfig((char *)0x0,global), argc < 2)) goto LAB_00114498;
LAB_001144e5:
    free(__s1);
  }
  PVar2 = parse_args(global,argc,argv);
  CVar4 = CURLE_OK;
  CVar3 = CURLE_OK;
  switch(PVar2) {
  case PARAM_OK:
    if ((global->libcurl == (char *)0x0) || (CVar3 = easysrc_init(), CVar3 == CURLE_OK)) {
      config = global->first;
      share = (CURLSH *)curl_share_init();
      if (share == (CURLSH *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
        if (global->libcurl != (char *)0x0) {
          easysrc_cleanup();
        }
      }
      else {
        i = 0;
        curl_share_setopt(share,1,2);
        curl_share_setopt(share,1,3);
        curl_share_setopt(share,1,4);
        curl_share_setopt(share,1,5);
        curl_share_setopt(share,1,6);
        curl_share_setopt(share,1,7);
        do {
          CVar3 = get_args(config,i);
          if (CVar3 != CURLE_OK) break;
          i = i + 1;
          config = config->next;
        } while (config != (OperationConfig *)0x0);
        global->current = global->first;
        CVar3 = run_all_transfers(global,share,CVar3);
        curl_share_cleanup(share);
        if (global->libcurl != (char *)0x0) {
          easysrc_cleanup();
          dumpeasysrc(global);
        }
      }
    }
    else {
      errorf(global,"out of memory");
    }
    break;
  case PARAM_HELP_REQUESTED:
    tool_help(global->help_category);
    CVar3 = CVar4;
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    CVar3 = CVar4;
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    CVar3 = CVar4;
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines();
    CVar3 = CVar4;
    break;
  case PARAM_CA_EMBED_REQUESTED:
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  default:
    if (PVar2 == PARAM_READ_ERROR) {
      CVar3 = CURLE_READ_ERROR;
      break;
    }
  case PARAM_OPTION_AMBIGUOUS:
  case PARAM_OPTION_UNKNOWN:
  case PARAM_REQUIRES_PARAMETER:
  case PARAM_BAD_USE:
  case PARAM_GOT_EXTRA_PARAMETER:
  case PARAM_BAD_NUMERIC:
  case PARAM_NEGATIVE_NUMERIC:
  case PARAM_LIBCURL_DOESNT_SUPPORT:
    CVar3 = CURLE_FAILED_INIT;
  }
switchD_00114511_caseD_9:
  varcleanup(global);
  return CVar3;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  char *first_arg = argc > 1 ? curlx_convert_tchar_to_UTF8(argv[1]) : NULL;

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  curlx_unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          /* Get the required arguments for each operation */
          do {
            result = get_args(operation, count++);

            operation = operation->next;
          } while(!result && operation);

          /* Set the current operation pointer */
          global->current = global->first;

          /* now run! */
          result = run_all_transfers(global, share, result);

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);

  return result;
}